

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

int fl_utf8len1(char c)

{
  undefined4 local_c;
  char c_local;
  
  if (((int)c & 0x80U) == 0) {
    local_c = 1;
  }
  else if ((c & 0x40U) == 0) {
    local_c = 1;
  }
  else if ((c & 0x20U) == 0) {
    local_c = 2;
  }
  else if ((c & 0x10U) == 0) {
    local_c = 3;
  }
  else if ((c & 8U) == 0) {
    local_c = 4;
  }
  else if ((c & 4U) == 0) {
    local_c = 5;
  }
  else {
    local_c = 6;
  }
  return local_c;
}

Assistant:

int fl_utf8len1(char c)
{
  if (!(c & 0x80)) return 1;
  if (c & 0x40) {
    if (c & 0x20) {
      if (c & 0x10) {
        if (c & 0x08) {
          if (c & 0x04) {
            return 6;
          }
          return 5;
        }
        return 4;
      }
      return 3;
    }
    return 2;
  }
  return 1;
}